

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadObs(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uchar *src;
  ulong uVar7;
  float fVar8;
  double dVar9;
  unsigned_short PRN_1;
  int SignalType_1;
  unsigned_short PRN;
  int SignalType;
  int sys;
  int local_40;
  int ChannelState;
  int i;
  int prn_1;
  int prn;
  int obsNum;
  char *buff;
  uchar *HeadBuff_local;
  BUFF *socketdata_local;
  ReadData *this_local;
  
  if ((this->Head).MessageID == 0x2b) {
    if (socketdata->len - socketdata->pos < (this->Head).MessageLength) {
      socketdata->pos = socketdata->pos + -0x1c;
      this_local._4_4_ = 2;
    }
    else {
      uVar7 = (ulong)((this->Head).MessageLength + 4);
      if ((long)uVar7 < 0) {
        uVar7 = 0xffffffffffffffff;
      }
      src = (uchar *)operator_new__(uVar7);
      memcpy(src,socketdata->buff + socketdata->pos,(long)((this->Head).MessageLength + 4));
      socketdata->pos = (this->Head).MessageLength + 4 + socketdata->pos;
      iVar3 = U2I(src,4);
      bVar1 = CRCCheck(HeadBuff,src,(this->Head).MessageLength,(this->Head).MessageLength);
      if (bVar1) {
        for (i = 0; i < 0x20; i = i + 1) {
          *(undefined8 *)(&this->field_0x1c10 + (long)i * 0x70) = 0xbff0000000000000;
          *(undefined8 *)(&this->field_0x1c18 + (long)i * 0x70) = 0xbff0000000000000;
        }
        for (ChannelState = 0; ChannelState < 0x40; ChannelState = ChannelState + 1) {
          *(undefined8 *)(&this->field_0x10 + (long)ChannelState * 0x70) = 0xbff0000000000000;
          *(undefined8 *)(&this->field_0x18 + (long)ChannelState * 0x70) = 0xbff0000000000000;
        }
        for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
          uVar4 = U2I(src + (long)(local_40 * 0x2c) + 0x2c,4);
          uVar5 = uVar4 >> 0x10 & 7;
          if (uVar5 == 0) {
            uVar4 = uVar4 >> 0x15 & 0x1f;
            iVar6 = U2I(src + (long)(local_40 * 0x2c) + 4,2);
            uVar2 = (short)iVar6 - 1;
            *(undefined8 *)(&this->field_0x1c00 + (ulong)uVar2 * 0x70) =
                 *(undefined8 *)&(this->Head).GPST;
            *(double *)((long)(&this->field_0x1c00 + (ulong)uVar2 * 0x70) + 8) =
                 (this->Head).GPST.SOW;
            if (uVar4 == 0) {
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 8),8);
              *(double *)(&this->field_0x1c10 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x10),4);
              *(float *)(&this->field_0x1c20 + (ulong)uVar2 * 0x70) = fVar8;
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 0x14),8);
              *(double *)(&this->field_0x1c28 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x1c),4);
              *(float *)(&this->field_0x1c38 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x20),4);
              *(float *)(&this->field_0x1c40 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x24),4);
              *(float *)(&this->field_0x1c48 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x28),4);
              *(float *)(&this->field_0x1c50 + (ulong)uVar2 * 0x70) = fVar8;
            }
            if (uVar4 == 9) {
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 8),8);
              *(double *)(&this->field_0x1c18 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x10),4);
              *(float *)(&this->field_0x1c24 + (ulong)uVar2 * 0x70) = fVar8;
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 0x14),8);
              *(double *)(&this->field_0x1c30 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x1c),4);
              *(float *)(&this->field_0x1c3c + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x20),4);
              *(float *)(&this->field_0x1c44 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x24),4);
              *(float *)(&this->field_0x1c4c + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x28),4);
              *(float *)(&this->field_0x1c54 + (ulong)uVar2 * 0x70) = fVar8;
            }
          }
          else if (uVar5 == 4) {
            uVar4 = uVar4 >> 0x15 & 0x1f;
            iVar6 = U2I(src + (long)(local_40 * 0x2c) + 4,2);
            uVar2 = (short)iVar6 - 1;
            *(undefined8 *)(&this->field_0x0 + (ulong)uVar2 * 0x70) =
                 *(undefined8 *)&(this->Head).GPST;
            *(double *)((long)(&this->field_0x0 + (ulong)uVar2 * 0x70) + 8) = (this->Head).GPST.SOW;
            if ((uVar4 == 0) || (uVar4 == 4)) {
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 8),8);
              *(double *)(&this->field_0x10 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x10),4);
              *(float *)(&this->field_0x20 + (ulong)uVar2 * 0x70) = fVar8;
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 0x14),8);
              *(double *)(&this->field_0x28 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x1c),4);
              *(float *)(&this->field_0x38 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x20),4);
              *(float *)(&this->field_0x40 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x24),4);
              *(float *)(&this->field_0x48 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x28),4);
              *(float *)(&this->field_0x50 + (ulong)uVar2 * 0x70) = fVar8;
            }
            if ((uVar4 == 2) || (uVar4 == 6)) {
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 8),8);
              *(double *)(&this->field_0x18 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x10),4);
              *(float *)(&this->field_0x24 + (ulong)uVar2 * 0x70) = fVar8;
              dVar9 = C2D((char *)(src + (long)(local_40 * 0x2c) + 0x14),8);
              *(double *)(&this->field_0x30 + (ulong)uVar2 * 0x70) = dVar9;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x1c),4);
              *(float *)(&this->field_0x3c + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x20),4);
              *(float *)(&this->field_0x44 + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x24),4);
              *(float *)(&this->field_0x4c + (ulong)uVar2 * 0x70) = fVar8;
              fVar8 = C2F((char *)(src + (long)(local_40 * 0x2c) + 0x28),4);
              *(float *)(&this->field_0x54 + (ulong)uVar2 * 0x70) = fVar8;
            }
          }
        }
        if (src != (uchar *)0x0) {
          operator_delete__(src);
        }
        this_local._4_4_ = 0;
      }
      else {
        if (src != (uchar *)0x0) {
          operator_delete__(src);
        }
        this_local._4_4_ = 3;
      }
    }
  }
  else {
    this_local._4_4_ = 6;
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::ReadObs(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 43)
        return CONFLICT_ID;
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        // reset(socketdata, pos);
        return FILE_OR_BUFF_END;
    }
    char* buff = new char [Head.MessageLength + 4];
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;

    int obsNum = U2I((unsigned char*)(buff), 4);
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength)){
        delete[] buff;
        return CRC_FAILED;
    }

    for(int prn = 0; prn < MAXGPSSRN; ++prn){
        this->GPSObs[prn].psr[0] = -1;
        this->GPSObs[prn].psr[1] = -1;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn){
        this->BDSObs[prn].psr[0] = -1;
        this->BDSObs[prn].psr[1] = -1;
    }
    try
    {
        for(int i = 0; i < obsNum; ++i)
        {
            int ChannelState = U2I((unsigned char*)(buff + i * 44 + 44), 4);
            int sys = (ChannelState >> 16) & 7;
            switch(sys)
            {
                case BDS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->BDSObs[PRN].ObsTime = Head.GPST;

                    // B1 signal
                    if(SignalType == 0 || SignalType == 4)
                    {
                        // cout << "B1   " << PRN << endl;
                        this->BDSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // B3 signal
                    if(SignalType == 2 || SignalType == 6)
                    {
                        // cout << "B3   " << PRN << endl;
                        this->BDSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                case GPS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->GPSObs[PRN].ObsTime = Head.GPST;
                    // L1 C/A
                    if(SignalType == 0)
                    {
                        this->GPSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // L2P
                    if(SignalType == 9)
                    {
                        this->GPSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                default: break;
            }
        }
    }
    catch(...)
    {
        cout << "error happened when reading obs" << endl;
        return UNKNOWN_ERROR;
    }
    delete[] buff;
    return 0;
    
}